

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrFutureCompletionBaseHeaderEXT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  XrStructureType XVar2;
  XrResult XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  PFN_xrResultToString p_Var6;
  XrStructureType __val;
  XrResult __val_00;
  uint uVar7;
  bool bVar8;
  char *pcVar9;
  XrInstance pXVar10;
  invalid_argument *this;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  _Alloc_hider _Var15;
  string out;
  string type_prefix;
  string next_prefix;
  string futureresult_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  long local_108;
  long local_100 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (value->type == XR_TYPE_WORLD_MESH_REQUEST_COMPLETION_ML) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    pcVar4 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar4,pcVar4 + prefix->_M_string_length);
    pcVar4 = (type_string->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar4,pcVar4 + type_string->_M_string_length);
    bVar8 = ApiDumpOutputXrStruct
                      (gen_dispatch_table,(XrWorldMeshRequestCompletionML *)value,&local_d0,
                       &local_70,is_pointer,contents);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    _Var15._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
      return bVar8;
    }
  }
  else {
    if (value->type != XR_TYPE_WORLD_MESH_STATE_REQUEST_COMPLETION_ML) {
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      local_130._M_dataplus._M_p = (pointer)value;
      std::__cxx11::string::_M_construct((ulong)&local_178,'\x12');
      *local_178._M_dataplus._M_p = '0';
      local_178._M_dataplus._M_p[1] = 'x';
      pcVar9 = local_178._M_dataplus._M_p + (local_178._M_string_length - 1);
      lVar12 = 0;
      do {
        bVar1 = *(byte *)((long)&local_130._M_dataplus._M_p + lVar12);
        *pcVar9 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
        pcVar9[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
        lVar12 = lVar12 + 1;
        pcVar9 = pcVar9 + -2;
      } while (lVar12 != 8);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,type_string,prefix,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)prefix);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      pcVar4 = (prefix->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar4,pcVar4 + prefix->_M_string_length);
      std::__cxx11::string::append((char *)&local_130);
      if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
        XVar2 = value->type;
        __val = -XVar2;
        if (0 < (int)XVar2) {
          __val = XVar2;
        }
        uVar14 = 1;
        if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
          uVar13 = (ulong)__val;
          uVar7 = 4;
          do {
            uVar14 = uVar7;
            uVar11 = (uint)uVar13;
            if (uVar11 < 100) {
              uVar14 = uVar14 - 2;
              goto LAB_00207488;
            }
            if (uVar11 < 1000) {
              uVar14 = uVar14 - 1;
              goto LAB_00207488;
            }
            if (uVar11 < 10000) goto LAB_00207488;
            uVar13 = uVar13 / 10000;
            uVar7 = uVar14 + 4;
          } while (99999 < uVar11);
          uVar14 = uVar14 + 1;
        }
LAB_00207488:
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_178,(char)uVar14 - (char)((int)XVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_178._M_dataplus._M_p + (XVar2 >> 0x1f),uVar14,__val);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)contents,(char (*) [16])"XrStructureType",&local_130,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_148 = 0;
        uStack_140 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_178.field_2._M_allocated_capacity = 0;
        local_178.field_2._8_8_ = 0;
        local_178._M_dataplus._M_p = (pointer)0x0;
        local_178._M_string_length = 0;
        p_Var5 = gen_dispatch_table->StructureTypeToString;
        pXVar10 = FindInstanceFromDispatchTable(gen_dispatch_table);
        (*p_Var5)(pXVar10,value->type,(char *)&local_178);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)contents,(char (*) [16])"XrStructureType",&local_130,(char (*) [64])&local_178
                  );
      }
      local_110 = local_100;
      pcVar4 = (prefix->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar4,pcVar4 + prefix->_M_string_length);
      std::__cxx11::string::append((char *)&local_110);
      value_00 = value->next;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_110,local_108 + (long)local_110);
      bVar8 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_90,contents);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (!bVar8) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Invalid Operation");
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      pcVar4 = (prefix->_M_dataplus)._M_p;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar4,pcVar4 + prefix->_M_string_length);
      std::__cxx11::string::append((char *)&local_f0);
      if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
        XVar3 = value->futureResult;
        __val_00 = -XVar3;
        if (XR_SUCCESS < XVar3) {
          __val_00 = XVar3;
        }
        uVar14 = 1;
        if (9 < (uint)__val_00) {
          uVar13 = (ulong)(uint)__val_00;
          uVar7 = 4;
          do {
            uVar14 = uVar7;
            uVar11 = (uint)uVar13;
            if (uVar11 < 100) {
              uVar14 = uVar14 - 2;
              goto LAB_0020768b;
            }
            if (uVar11 < 1000) {
              uVar14 = uVar14 - 1;
              goto LAB_0020768b;
            }
            if (uVar11 < 10000) goto LAB_0020768b;
            uVar13 = uVar13 / 10000;
            uVar7 = uVar14 + 4;
          } while (99999 < uVar11);
          uVar14 = uVar14 + 1;
        }
LAB_0020768b:
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar14 - (char)(XVar3 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_178._M_dataplus._M_p + ((uint)XVar3 >> 0x1f),uVar14,__val_00);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)contents,(char (*) [9])"XrResult",&local_f0,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_148 = 0;
        uStack_140 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_178.field_2._M_allocated_capacity = 0;
        local_178.field_2._8_8_ = 0;
        local_178._M_dataplus._M_p = (pointer)0x0;
        local_178._M_string_length = 0;
        p_Var6 = gen_dispatch_table->ResultToString;
        pXVar10 = FindInstanceFromDispatchTable(gen_dispatch_table);
        (*p_Var6)(pXVar10,value->futureResult,(char *)&local_178);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[9],std::__cxx11::string&,char(&)[64]>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)contents,(char (*) [9])"XrResult",&local_f0,(char (*) [64])&local_178);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != local_100) {
        operator_delete(local_110,local_100[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      return true;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar4 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,pcVar4 + prefix->_M_string_length);
    pcVar4 = (type_string->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,pcVar4 + type_string->_M_string_length);
    bVar8 = ApiDumpOutputXrStruct
                      (gen_dispatch_table,(XrWorldMeshStateRequestCompletionML *)value,&local_b0,
                       &local_50,is_pointer,contents);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_d0.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
    _Var15._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return bVar8;
    }
  }
  operator_delete(_Var15._M_p,local_d0.field_2._M_allocated_capacity + 1);
  return bVar8;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrFutureCompletionBaseHeaderEXT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        if (value->type == XR_TYPE_WORLD_MESH_STATE_REQUEST_COMPLETION_ML) {
            const XrWorldMeshStateRequestCompletionML* new_value = reinterpret_cast<const XrWorldMeshStateRequestCompletionML*>(value);
            return ApiDumpOutputXrStruct(gen_dispatch_table, new_value, prefix, type_string, is_pointer, contents);
        }
        if (value->type == XR_TYPE_WORLD_MESH_REQUEST_COMPLETION_ML) {
            const XrWorldMeshRequestCompletionML* new_value = reinterpret_cast<const XrWorldMeshRequestCompletionML*>(value);
            return ApiDumpOutputXrStruct(gen_dispatch_table, new_value, prefix, type_string, is_pointer, contents);
        }
        // Fallback path - Just output generic information about the base struct
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string futureresult_prefix = prefix;
        futureresult_prefix += "futureResult";
        if (nullptr != gen_dispatch_table) {
            char futureResult_string[XR_MAX_RESULT_STRING_SIZE] = {};
            gen_dispatch_table->ResultToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                               value->futureResult, futureResult_string);
            contents.emplace_back("XrResult", futureresult_prefix, futureResult_string);
        } else {
                        contents.emplace_back("XrResult", futureresult_prefix, std::to_string(value->futureResult));
        }
        return true;
    } catch(...) {
    }
    return false;
}